

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

CTxMemPool * GetMemPool(any *context,HTTPRequest *req)

{
  NodeContext *pNVar1;
  CTxMemPool *pCVar2;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = util::AnyPtr<node::NodeContext>(context);
  if ((pNVar1 == (NodeContext *)0x0) ||
     (pCVar2 = (pNVar1->mempool)._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl, pCVar2 == (CTxMemPool *)0x0)
     ) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Mempool disabled or instance not found","");
    RESTERR(req,HTTP_NOT_FOUND,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pCVar2 = (CTxMemPool *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

static CTxMemPool* GetMemPool(const std::any& context, HTTPRequest* req)
{
    auto node_context = util::AnyPtr<NodeContext>(context);
    if (!node_context || !node_context->mempool) {
        RESTERR(req, HTTP_NOT_FOUND, "Mempool disabled or instance not found");
        return nullptr;
    }
    return node_context->mempool.get();
}